

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O3

bool TasOptimization::testParticleSwarmState(bool verbose)

{
  double dVar1;
  double dVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  _Bit_type _Var7;
  bool bVar8;
  _Bit_type *p_Var9;
  undefined8 uVar10;
  value_type_conflict1 *__val;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  double *pdVar16;
  byte bVar17;
  long lVar18;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  char *pcVar19;
  undefined7 in_register_00000039;
  ulong uVar20;
  bool bVar21;
  double dVar22;
  initializer_list<TasOptimization::ParticleSwarmState> __l;
  initializer_list<bool> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<bool> __l_03;
  initializer_list<bool> __l_04;
  initializer_list<bool> __l_05;
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  states;
  vector<double,_std::allocator<double>_> ones1;
  vector<double,_std::allocator<double>_> ones2;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  vector<double,_std::allocator<double>_> velocities;
  vector<double,_std::allocator<double>_> positions;
  minstd_rand park_miller;
  ParticleSwarmState state;
  allocator_type local_35d;
  undefined4 local_35c;
  undefined1 local_358 [2];
  bool bStack_356;
  bool bStack_355;
  undefined4 uStack_354;
  double *pdStack_350;
  pointer local_348;
  uint uStack_340;
  undefined4 uStack_33c;
  _Bit_pointer local_338;
  undefined1 local_330 [16];
  pointer local_320;
  uint uStack_318;
  undefined4 uStack_314;
  _Bit_pointer local_310;
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  local_308;
  undefined1 local_2ec [4];
  vector<double,_std::allocator<double>_> local_2e8;
  vector<double,_std::allocator<double>_> local_2c8;
  void *local_2b0;
  long local_2a8;
  long local_2a0;
  void *local_298;
  long local_290;
  long local_288;
  vector<double,_std::allocator<double>_> local_280;
  vector<double,_std::allocator<double>_> local_268;
  vector<double,_std::allocator<double>_> local_250;
  vector<double,_std::allocator<double>_> local_238;
  undefined8 *local_220;
  undefined8 *local_218;
  code *local_210;
  code *local_208;
  undefined8 local_200;
  ParticleSwarmState local_1f8 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_298 = operator_new(0xf0);
  lVar18 = (long)local_298 + 0xf0;
  local_288 = lVar18;
  memset(local_298,0,0xf0);
  local_290 = lVar18;
  local_2b0 = operator_new(0xf0);
  lVar18 = (long)local_2b0 + 0xf0;
  local_2a0 = lVar18;
  memset(local_2b0,0,0xf0);
  local_2a8 = lVar18;
  TasOptimization::ParticleSwarmState::ParticleSwarmState(local_1f8,2,0xf);
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            (local_1f8 + 1,2,(vector *)&local_298,(vector *)&local_2b0);
  local_35c = (undefined4)CONCAT71(in_register_00000039,verbose);
  __l._M_len = 2;
  __l._M_array = local_1f8;
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::vector(&local_308,__l,(allocator_type *)local_358);
  lVar18 = 0xd8;
  do {
    ParticleSwarmState::~ParticleSwarmState
              ((ParticleSwarmState *)(&local_1f8[0].positions_initialized + lVar18));
    lVar18 = lVar18 + -0xd8;
  } while (lVar18 != -0xd8);
  lVar18 = 0;
  bVar17 = 1;
  bVar21 = true;
  do {
    bVar8 = bVar21;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1f8,
               &local_308.
                super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].particle_positions);
    lVar11 = local_1f8[0]._8_8_ - local_1f8[0]._0_8_;
    if ((ulong *)local_1f8[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f8[0]._0_8_,
                      (long)local_1f8[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f8[0]._0_8_);
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1f8,
               &local_308.
                super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].particle_velocities);
    lVar12 = local_1f8[0]._8_8_ - local_1f8[0]._0_8_;
    if ((ulong *)local_1f8[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f8[0]._0_8_,
                      (long)local_1f8[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f8[0]._0_8_);
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1f8,
               &local_308.
                super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].best_particle_positions);
    lVar13 = local_1f8[0]._8_8_ - local_1f8[0]._0_8_;
    if ((ulong *)local_1f8[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f8[0]._0_8_,
                      (long)local_1f8[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f8[0]._0_8_);
    }
    __first._M_current =
         local_308.
         super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar18].best_particle_positions.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start +
         (long)local_308.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar18].num_particles *
         (long)local_308.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar18].num_dimensions;
    std::vector<double,std::allocator<double>>::
    vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,std::allocator<double>> *)local_1f8,__first,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (__first._M_current +
               local_308.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar18].num_dimensions),
               (allocator_type *)local_358);
    lVar14 = local_1f8[0]._8_8_ - local_1f8[0]._0_8_;
    if ((ulong *)local_1f8[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f8[0]._0_8_,
                      (long)local_1f8[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f8[0]._0_8_);
    }
    p_Var9 = (_Bit_type *)_local_358;
    uStack_354 = SUB84(p_Var9,4);
    _local_358 = CONCAT13(local_308.
                          super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar18].cache_initialized,
                          CONCAT12(local_308.
                                   super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                   best_positions_initialized,
                                   CONCAT11(local_308.
                                            super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                            velocities_initialized,
                                            local_308.
                                            super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                            positions_initialized)));
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)local_358;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_1f8,__l_00,(allocator_type *)local_330);
    uVar20 = *(ulong *)local_1f8[0]._0_8_;
    bVar15 = (byte)uVar20;
    if (bVar8) {
      bVar15 = bVar15 ^ 1;
      bVar21 = (uVar20 & 2) == 0;
    }
    else {
      bVar21 = SUB41(((uint)uVar20 & 2) >> 1,0);
    }
    bVar17 = (uVar20 & 0xc) == 0 & bVar21 &
             bVar17 & lVar11 == 0xf0 & lVar12 == 0xf0 & lVar13 == 0x100 & lVar14 == 0x10 & bVar15;
    operator_delete((void *)local_1f8[0]._0_8_,
                    (long)local_1f8[0].particle_positions.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_1f8[0]._0_8_);
    lVar18 = 1;
    bVar21 = false;
  } while (bVar8);
  local_1f8[0].positions_initialized = false;
  local_1f8[0].velocities_initialized = false;
  local_1f8[0].best_positions_initialized = false;
  local_1f8[0].cache_initialized = false;
  local_1f8[0].num_dimensions = -0x40100000;
  local_1f8[0].num_particles = 0;
  local_1f8[0]._12_4_ = 0x3ff00000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1f8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_268,__l_01,(allocator_type *)local_358);
  local_1f8[0].positions_initialized = false;
  local_1f8[0].velocities_initialized = false;
  local_1f8[0].best_positions_initialized = false;
  local_1f8[0].cache_initialized = false;
  local_1f8[0].num_dimensions = 0x40000000;
  local_1f8[0].num_particles = 0;
  local_1f8[0]._12_4_ = 0x40080000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1f8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_280,__l_02,(allocator_type *)local_358);
  local_218 = &local_200;
  local_200 = 0x2a;
  local_220 = &local_48;
  local_48 = 0;
  uStack_40 = 0x3ff0000000000000;
  local_208 = std::
              _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:86:21)>
              ::_M_invoke;
  local_210 = std::
              _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:86:21)>
              ::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            (local_308.
             super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_268,&local_280);
  if (local_210 != (code *)0x0) {
    (*local_210)(&local_220,&local_220,3);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_238,
             &(local_308.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->particle_positions);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_250,
             &(local_308.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->particle_velocities);
  uVar10 = local_1f8[0]._0_8_;
  lVar18 = 0;
  do {
    uVar20 = (ulong)(((uint)lVar18 & 1) << 3);
    dVar1 = *(double *)
             ((long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar20);
    dVar2 = *(double *)
             ((long)local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar20);
    dVar22 = ABS(dVar2 - dVar1);
    bVar17 = -(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar18] <= dVar22 + 1e-12) &
             -(-1e-12 - dVar22 <=
              local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar18]) &
             local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18] <= dVar2 + 1e-12 &
             dVar1 + -1e-12 <=
             local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18] & bVar17;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x1e);
  uVar3 = (local_308.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->positions_initialized;
  uVar4 = (local_308.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->velocities_initialized;
  uVar5 = (local_308.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->best_positions_initialized;
  uVar6 = (local_308.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->cache_initialized;
  local_1f8[0].cache_initialized = (bool)uVar6;
  local_1f8[0].best_positions_initialized = (bool)uVar5;
  local_1f8[0].velocities_initialized = (bool)uVar4;
  local_1f8[0].positions_initialized = (bool)uVar3;
  local_1f8[0].num_dimensions = SUB84(uVar10,4);
  __l_03._M_len = 4;
  __l_03._M_array = &local_1f8[0].positions_initialized;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_358,__l_03,(allocator_type *)local_330);
  _Var7 = (_Bit_type)*_local_358;
  TasOptimization::ParticleSwarmState::ParticleSwarmState(local_1f8,2,0xf);
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0xf0);
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 0x1e;
  lVar18 = 0;
  do {
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar18] = 1.0;
    (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start + lVar18)[1] = 1.0;
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x1e);
  local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x100);
  local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 0x20;
  lVar18 = 0;
  do {
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar18] = 1.0;
    (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start + lVar18)[1] = 1.0;
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x20);
  local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  ParticleSwarmState::setParticlePositions(local_1f8,&local_2e8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_330,&local_1f8[0].particle_positions);
  bVar17 = bVar17 & ((uint)_Var7 & 3) == 3;
  for (pdVar16 = (double *)local_330._0_8_; pdVar16 != (double *)local_330._8_8_;
      pdVar16 = pdVar16 + 1) {
    bVar17 = bVar17 & *pdVar16 == 1.0;
  }
  if ((double *)local_330._0_8_ != (double *)0x0) {
    operator_delete((void *)local_330._0_8_,(long)local_320 - local_330._0_8_);
  }
  ParticleSwarmState::setParticleVelocities(local_1f8,&local_2e8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_330,&local_1f8[0].particle_velocities)
  ;
  for (pdVar16 = (double *)local_330._0_8_; pdVar16 != (double *)local_330._8_8_;
      pdVar16 = pdVar16 + 1) {
    bVar17 = bVar17 & *pdVar16 == 1.0;
  }
  if ((double *)local_330._0_8_ != (double *)0x0) {
    operator_delete((void *)local_330._0_8_,(long)local_320 - local_330._0_8_);
  }
  ParticleSwarmState::setBestParticlePositions(local_1f8,&local_2c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_330,
             &local_1f8[0].best_particle_positions);
  for (pdVar16 = (double *)local_330._0_8_; pdVar16 != (double *)local_330._8_8_;
      pdVar16 = pdVar16 + 1) {
    bVar17 = bVar17 & *pdVar16 == 1.0;
  }
  if ((double *)local_330._0_8_ != (double *)0x0) {
    operator_delete((void *)local_330._0_8_,(long)local_320 - local_330._0_8_);
  }
  uVar10 = local_1f8[0]._0_8_;
  local_2ec[0] = local_1f8[0].positions_initialized;
  local_2ec[1] = local_1f8[0].velocities_initialized;
  local_2ec[2] = local_1f8[0].best_positions_initialized;
  local_2ec[3] = local_1f8[0].cache_initialized;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_2ec;
  local_1f8[0]._0_8_ = uVar10;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_330,__l_04,&local_35d);
  if (_local_358 != (double *)0x0) {
    operator_delete(_local_358,(long)local_338 - (long)_local_358);
  }
  local_338 = local_310;
  local_348 = local_320;
  uStack_340 = uStack_318;
  uStack_33c = uStack_314;
  _local_358 = (double *)local_330._0_8_;
  pdStack_350 = (double *)local_330._8_8_;
  dVar1 = *(double *)local_330._0_8_;
  local_1f8[0].best_positions_initialized = false;
  if (local_1f8[0].best_particle_positions.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1f8[0].best_particle_positions.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    memset(local_1f8[0].best_particle_positions.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start,0,
           (long)local_1f8[0].best_particle_positions.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)local_1f8[0].best_particle_positions.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start & 0xfffffffffffffff8);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_330,
             &(local_308.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->best_particle_positions);
  bVar17 = bVar17 & (SUB84(dVar1,0) & 7) == 7;
  for (pdVar16 = (double *)local_330._0_8_; pdVar16 != (double *)local_330._8_8_;
      pdVar16 = pdVar16 + 1) {
    bVar17 = bVar17 & *pdVar16 == 0.0;
  }
  bVar15 = (byte)local_35c;
  if ((double *)local_330._0_8_ != (double *)0x0) {
    operator_delete((void *)local_330._0_8_,(long)local_320 - local_330._0_8_);
  }
  uVar10 = local_1f8[0]._0_8_;
  local_2ec[0] = local_1f8[0].positions_initialized;
  local_2ec[1] = local_1f8[0].velocities_initialized;
  local_2ec[2] = local_1f8[0].best_positions_initialized;
  local_2ec[3] = local_1f8[0].cache_initialized;
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)local_2ec;
  local_1f8[0]._0_8_ = uVar10;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_330,__l_05,&local_35d);
  if (_local_358 != (double *)0x0) {
    operator_delete(_local_358,(long)local_338 - (long)_local_358);
  }
  local_338 = local_310;
  local_348 = local_320;
  uStack_340 = uStack_318;
  uStack_33c = uStack_314;
  _local_358 = (double *)local_330._0_8_;
  pdStack_350 = (double *)local_330._8_8_;
  bVar21 = (bool)(bVar17 & ((ulong)*(double *)local_330._0_8_ & 4) == 0);
  if ((byte)(bVar21 ^ 1U | bVar15) == 1) {
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x14;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Particle Swarm",0xe);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x1e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"State Unit Tests",0x10);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0xf;
    pcVar19 = "FAIL";
    if (bVar21 != false) {
      pcVar19 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ParticleSwarmState::~ParticleSwarmState(local_1f8);
  if (_local_358 != (double *)0x0) {
    operator_delete(_local_358,(long)local_338 - (long)_local_358);
  }
  if (local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::~vector(&local_308);
  if (local_2b0 != (void *)0x0) {
    operator_delete(local_2b0,local_2a0 - (long)local_2b0);
  }
  if (local_298 != (void *)0x0) {
    operator_delete(local_298,local_288 - (long)local_298);
  }
  return bVar21;
}

Assistant:

bool testParticleSwarmState(bool verbose) {
    test_result test;

    // Check size of the accessible vectors generated by different constructors.
    int num_dimensions = 2;
    int num_particles = 15;
    std::vector<double> dummy_positions(num_dimensions * num_particles);
    std::vector<double> dummy_velocities(num_dimensions * num_particles);
    std::vector<ParticleSwarmState> states = {
        ParticleSwarmState(num_dimensions, num_particles),
        ParticleSwarmState(num_dimensions, std::move(dummy_positions), std::move(dummy_velocities))
    };
    for (int i=0; i<2; i++) {
        test.tassert(states[i].getParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getParticleVelocities().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getBestParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles+1));
        test.tassert(states[i].getBestPosition().size() == (size_t) num_dimensions);
        std::vector<bool> init_vector = states[i].getStateVector();
        test.tassert(i == 0 ? not init_vector[0] : init_vector[0]);
        test.tassert(i == 0 ? not init_vector[1] : init_vector[1]);
        test.tassert(not init_vector[2]);
        test.tassert(not init_vector[3]);
    }

    // Check TasOptimization::ParticleSwarmState::initializeParticlesInsideBox().
    std::vector<double> lower = {-1.0, 1.0};
    std::vector<double> upper = {2.0, 3.0};
    std::minstd_rand park_miller(42);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    auto get_rand = [&]()->double{ return unif(park_miller); };
    states[0].initializeParticlesInsideBox(lower, upper, get_rand);
    std::vector<double> positions = states[0].getParticlePositions();
    std::vector<double> velocities = states[0].getParticleVelocities();
    for (int i=0; i<num_particles * num_dimensions; i++) {
        test.tassert(positions[i] >= lower[i % num_dimensions] - TasGrid::Maths::num_tol);
        test.tassert(positions[i] <= upper[i % num_dimensions] + TasGrid::Maths::num_tol);
        double range = fabs(upper[i % num_dimensions] - lower[i % num_dimensions]);
        test.tassert(velocities[i] >= -range - TasGrid::Maths::num_tol);
        test.tassert(velocities[i] <=  range + TasGrid::Maths::num_tol);
    }
    std::vector<bool> init_vector = states[0].getStateVector();
    test.tassert(init_vector[0] and init_vector[1]);

    // Check the nontrivial setters.
    ParticleSwarmState state(num_dimensions, num_particles);
    std::vector<double> ones1(num_dimensions * num_particles, 1);
    std::vector<double> ones2(num_dimensions * (num_particles + 1), 1);
    state.setParticlePositions(ones1);
    for (auto p : state.getParticlePositions()) test.tassert(p == 1);
    state.setParticleVelocities(ones1);
    for (auto v : state.getParticleVelocities()) test.tassert(v == 1);
    state.setBestParticlePositions(ones2);
    for (auto bp : state.getBestParticlePositions()) test.tassert(bp == 1);
    init_vector = state.getStateVector();
    test.tassert(init_vector[0] and init_vector[1] and init_vector[2]);

    // Check TasOptimization::ParticleSwarmState::clearBestParticles().
    state.clearBestParticles();
    for (auto bp : states[0].getBestParticlePositions()) test.tassert(bp == 0);
    init_vector = state.getStateVector();
    test.tassert(not init_vector[2]);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Particle Swarm", "State Unit Tests");
    return test.success();
}